

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void sylvan_init_mtbdd(void)

{
  Task local_40;
  
  sylvan_init_mt();
  if (mtbdd_initialized == '\0') {
    mtbdd_initialized = '\x01';
    sylvan_register_quit(mtbdd_quit);
    sylvan_gc_add_mark(mtbdd_gc_mark_external_refs_CALL);
    sylvan_gc_add_mark(mtbdd_gc_mark_protected_CALL);
    refs_create(&mtbdd_refs,0x400);
    if (mtbdd_protected_created == '\0') {
      protect_create(&mtbdd_protected,0x1000);
      mtbdd_protected_created = '\x01';
    }
    local_40.f = mtbdd_refs_init_WRAP;
    local_40.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
    lace_run_task(&local_40);
  }
  return;
}

Assistant:

void
sylvan_init_mtbdd()
{
    sylvan_init_mt();

    if (mtbdd_initialized) return;
    mtbdd_initialized = 1;

    sylvan_register_quit(mtbdd_quit);
    sylvan_gc_add_mark(TASK(mtbdd_gc_mark_external_refs));
    sylvan_gc_add_mark(TASK(mtbdd_gc_mark_protected));

    refs_create(&mtbdd_refs, 1024);
    if (!mtbdd_protected_created) {
        protect_create(&mtbdd_protected, 4096);
        mtbdd_protected_created = 1;
    }

    RUN(mtbdd_refs_init);
}